

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
optCompare_valueOptNotEmptyGreater_Test::optCompare_valueOptNotEmptyGreater_Test
          (optCompare_valueOptNotEmptyGreater_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001c7658;
  return;
}

Assistant:

TEST(optCompare, valueOptNotEmptyGreater)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i{1};
  EXPECT_FALSE(2 == i);
  EXPECT_TRUE(2 != i);
  EXPECT_FALSE(2 < i);
  EXPECT_TRUE(2 > i);
  EXPECT_FALSE(2 <= i);
  EXPECT_TRUE(2 >= i);
}